

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

wstring * __thiscall
mjs::number_to_fixed_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int f)

{
  wstringstream wss;
  ulong uStack_190;
  wostream local_188 [8];
  undefined4 local_180 [92];
  
  if ((((ulong)ABS(x) < 0x7ff0000000000000) && (ABS(x) < 1e+21)) && ((uint)this < 0x15)) {
    std::__cxx11::wstringstream::wstringstream((wstringstream *)&wss);
    if (x < 0.0) {
      std::operator<<(local_188,L'-');
      x = -x;
    }
    *(ulong *)((long)&uStack_190 + *(long *)(_wss + -0x18)) = (ulong)this & 0xffffffff;
    *(undefined4 *)((long)local_180 + *(long *)(_wss + -0x18)) = 4;
    std::wostream::_M_insert<double>(x);
    std::__cxx11::wstringbuf::str();
    std::__cxx11::wstringstream::~wstringstream((wstringstream *)&wss);
    return __return_storage_ptr__;
  }
  __assert_fail("std::isfinite(x) && std::fabs(x) < 1e21 && f >= 0 && f <= 20",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0xa0,"std::wstring mjs::number_to_fixed(double, int)");
}

Assistant:

std::wstring number_to_fixed(double x, int f) {
    // TODO: Implement actual rules from ES3, 15.7.4.5
    assert(std::isfinite(x) && std::fabs(x) < 1e21 && f >= 0 && f <= 20);
    std::wstringstream wss;
    if (x < 0) {
        x = -x;
        wss << L'-';
    }
    wss.precision(f);
    wss.flags(std::ios::fixed);
    wss << x;
    return wss.str();
}